

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_GpuContainers.H
# Opt level: O0

void amrex::Gpu::copy<ProbParm*,ProbParm*>(void *param_1,undefined8 param_2,ProbParm *param_3)

{
  difference_type dVar1;
  difference_type size;
  ProbParm *in_stack_ffffffffffffffd8;
  
  dVar1 = std::distance<ProbParm*>(param_3,in_stack_ffffffffffffffd8);
  if (dVar1 != 0) {
    memcpy(param_3,param_1,dVar1 << 5);
  }
  return;
}

Assistant:

void copy (HostToDevice, InIter begin, InIter end, OutIter result) noexcept
    {
        using value_type = typename std::iterator_traits<InIter>::value_type;
        static_assert(std::is_trivially_copyable<value_type>(),
                      "Can only copy trivially copyable types");
        auto size = std::distance(begin, end);
        if (size == 0) return;
#ifdef AMREX_USE_GPU
        htod_memcpy(&(*result), &(*begin), size*sizeof(value_type));
#else
        std::memcpy(&(*result), &(*begin), size*sizeof(value_type));
#endif
    }